

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_value.c
# Opt level: O0

gravity_closure_t * gravity_class_lookup_constructor(gravity_class_t *c,uint32_t nparams)

{
  gravity_value_t key_00;
  gravity_value_t key_01;
  gravity_value_t key_02;
  size_t sVar1;
  gravity_value_t key;
  gravity_string_t __temp;
  gravity_value_t key_1;
  gravity_string_t __temp_1;
  char name [256];
  gravity_value_t key_2;
  gravity_string_t __temp_2;
  uint32_t nparams_local;
  gravity_class_t *c_local;
  
  __temp_2._68_4_ = nparams;
  if (c->xdata == (void *)0x0) {
    key.field_1.p = gravity_class_string;
    memset(&__temp,0,0x28);
    __temp.gc.next = (gravity_object_t *)0x174926;
    __temp.s._0_4_ = 0;
    __temp.s._4_4_ = 4;
    __temp.hash = 0;
    __temp.s._0_4_ = gravity_hash_compute_buffer("init",4);
    key.isa = (gravity_class_t *)&key.field_1;
    key_00.field_1.p = key.isa;
    key_00.isa = gravity_class_string;
    c_local = gravity_class_lookup(c,key_00);
  }
  else if (nparams == 0) {
    key_2.field_1.p = gravity_class_string;
    memset(&__temp_2,0,0x28);
    __temp_2.gc.next = (gravity_object_t *)anon_var_dwarf_23b8;
    __temp_2.s._0_4_ = 0;
    __temp_2.s._4_4_ = 5;
    __temp_2.hash = 0;
    __temp_2.s._0_4_ = gravity_hash_compute_buffer("$init",5);
    key_2.isa = (gravity_class_t *)&key_2.field_1;
    key_02.field_1.p = key_2.isa;
    key_02.isa = gravity_class_string;
    c_local = gravity_class_lookup(c,key_02);
  }
  else {
    snprintf((char *)&__temp_1.alloc,0x100,"%s%d","$init",(ulong)nparams);
    key_1.field_1.p = gravity_class_string;
    memset(&__temp_1,0,0x28);
    __temp_1.gc.next = (gravity_object_t *)&__temp_1.alloc;
    __temp_1.s._0_4_ = 0;
    sVar1 = strlen((char *)&__temp_1.alloc);
    __temp_1.s._4_4_ = (uint32_t)sVar1;
    __temp_1.hash = 0;
    __temp_1.s._0_4_ = gravity_hash_compute_buffer((char *)__temp_1.gc.next,__temp_1.s._4_4_);
    __temp._64_8_ = gravity_class_string;
    key_1.isa = (gravity_class_t *)&key_1.field_1;
    key_01.field_1.p = key_1.isa;
    key_01.isa = gravity_class_string;
    c_local = gravity_class_lookup(c,key_01);
  }
  return (gravity_closure_t *)c_local;
}

Assistant:

inline gravity_closure_t *gravity_class_lookup_constructor (gravity_class_t *c, uint32_t nparams) {
    if (c->xdata) {
        // bridged class so check for special $initN function
        if (nparams == 0) {
            STATICVALUE_FROM_STRING(key, CLASS_INTERNAL_INIT_NAME, strlen(CLASS_INTERNAL_INIT_NAME));
            return (gravity_closure_t *)gravity_class_lookup(c, key);
        }

        // for bridged classed (which can have more than one init constructor like in objc) the convention is
        // to map each bridged init with a special $initN function (where N>0 is num params)
        char name[256]; snprintf(name, sizeof(name), "%s%d", CLASS_INTERNAL_INIT_NAME, nparams);
        STATICVALUE_FROM_STRING(key, name, strlen(name));
        return (gravity_closure_t *)gravity_class_lookup(c, key);
    }

    // for non bridge classes just check for constructor
    STATICVALUE_FROM_STRING(key, CLASS_CONSTRUCTOR_NAME, strlen(CLASS_CONSTRUCTOR_NAME));
    return (gravity_closure_t *)gravity_class_lookup(c, key);
}